

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O2

Abc_Cex_t * Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x162,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  uVar8 = 0;
  pAVar2 = Abc_CexAlloc(0,p->nObjs,pCex->iFrame + 1);
  iVar1 = pCex->iFrame;
  pAVar2->iPo = pCex->iPo;
  pAVar2->iFrame = iVar1;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  while( true ) {
    iVar1 = (int)uVar8;
    if (p->nRegs <= iVar1) break;
    pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar3 =
         *(ulong *)pGVar3 & 0xffffffffbfffffff |
         (ulong)(((uint)(&pCex[1].iPo)[uVar8 >> 5] >> ((byte)uVar8 & 0x1f) & 1) << 0x1e);
    uVar8 = (ulong)(iVar1 + 1);
  }
  if (pCex->nRegs != iVar1) {
    __assert_fail("iBit == pCex->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                  ,0x16c,"Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)")
    ;
  }
  iVar1 = 0;
  do {
    if (pCex->iFrame < iVar1) {
      if ((int)uVar8 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                      ,0x17b,
                      "Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)");
      }
      pGVar3 = Gia_ManPo(p,pCex->iPo);
      if ((pGVar3->field_0x3 & 0x40) != 0) {
        Gia_ManCleanMark0(p);
        return pAVar2;
      }
      __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCex.c"
                    ,0x17c,
                    "Abc_Cex_t *Gia_ManCexExtendToIncludeAllObjects(Gia_Man_t *, Abc_Cex_t *)");
    }
    for (iVar9 = 0; uVar7 = (int)uVar8 + iVar9, iVar9 < p->vCis->nSize - p->nRegs; iVar9 = iVar9 + 1
        ) {
      pGVar3 = Gia_ManCi(p,iVar9);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[(int)uVar7 >> 5] >> ((byte)uVar7 & 0x1f) & 1) << 0x1e);
    }
    for (iVar9 = 0; iVar9 < p->nRegs; iVar9 = iVar9 + 1) {
      pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar9);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar9);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar3 & 0x40000000)
      ;
    }
    for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
      pGVar3 = Gia_ManObj(p,iVar9);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if ((pGVar3->field_0x3 & 0x40) != 0) {
        iVar5 = pAVar2->nPis * iVar1 + iVar9;
        (&pAVar2[1].iPo)[iVar5 >> 5] = (&pAVar2[1].iPo)[iVar5 >> 5] | 1 << ((byte)iVar5 & 0x1f);
      }
    }
    for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
      pGVar3 = Gia_ManObj(p,iVar9);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(ulong *)pGVar3;
      if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
        uVar6 = (uint)(uVar8 >> 0x20);
        *(ulong *)pGVar3 =
             uVar8 & 0xffffffff3fffffff |
             (ulong)(((uVar6 >> 0x1d ^ *(uint *)(pGVar3 + -(ulong)(uVar6 & 0x1fffffff)) >> 0x1e) &
                      ((uint)(uVar8 >> 0x1d) & 7 ^ *(uint *)(pGVar3 + -(uVar8 & 0x1fffffff)) >> 0x1e
                      ) & 1) << 0x1e);
      }
    }
    for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
      pGVar3 = Gia_ManCo(p,iVar9);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar6 = (uint)*(ulong *)pGVar3;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)((uVar6 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar6 & 0x1fffffff))) & 0x40000000);
    }
    iVar1 = iVar1 + 1;
    uVar8 = (ulong)uVar7;
  } while( true );
}

Assistant:

Abc_Cex_t * Gia_ManCexExtendToIncludeAllObjects( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManObjNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
        pObjRi->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    assert( iBit == pCex->nRegs );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        Gia_ManForEachObj( p, pObj, k )
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );
    Gia_ManCleanMark0(p);
    return pNew;
}